

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram.cpp
# Opt level: O2

void __thiscall QNetworkDatagram::QNetworkDatagram(QNetworkDatagram *this)

{
  QNetworkDatagramPrivate *this_00;
  long in_FS_OFFSET;
  QHostAddress local_50;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkDatagramPrivate *)operator_new(0x40);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char *)0x0;
  local_48.size = 0;
  QHostAddress::QHostAddress(&local_50);
  QNetworkDatagramPrivate::QNetworkDatagramPrivate(this_00,(QByteArray *)&local_48,&local_50,0);
  QHostAddress::~QHostAddress(&local_50);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  this->d = this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkDatagram::QNetworkDatagram()
    : d(new QNetworkDatagramPrivate)
{
}